

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::default_cost_type<long_double>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (default_cost_type<long_double> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  longdouble *plVar1;
  longdouble lVar2;
  longdouble lVar3;
  undefined8 extraout_RAX;
  ushort uVar4;
  pointer in_RCX;
  longdouble *plVar5;
  longdouble *plVar6;
  pointer ppVar7;
  pointer ppVar8;
  pointer ppVar9;
  long lVar10;
  pointer ppVar11;
  baryonyx *this_00;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__urng;
  int iVar12;
  long in_R8;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_long_double>
  __aurng;
  pointer ppVar13;
  bool bVar14;
  longdouble in_ST0;
  longdouble lVar15;
  longdouble lVar16;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar17;
  vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> r;
  allocator_type local_8d;
  longdouble local_8c;
  vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> local_80;
  longdouble local_64;
  ulong local_58;
  default_cost_type<long_double> *local_50;
  undefined1 local_48 [24];
  
  local_50 = this;
  std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::vector
            (&local_80,(long)n,&local_8d);
  ppVar11 = local_80.
            super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = (ulong)(uint)n;
  if (n != 0) {
    lVar10 = 0;
    iVar12 = 0;
    plVar1 = (local_50->linear_elements)._M_t.
             super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
             super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
             super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
    do {
      *(unkbyte10 *)
       ((long)&(local_80.
                super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first + lVar10 * 2) =
           *(unkbyte10 *)((long)plVar1 + lVar10);
      *(int *)((long)&(local_80.
                       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->second + lVar10 * 2) = iVar12;
      iVar12 = iVar12 + 1;
      lVar10 = lVar10 + 0x10;
      in_RCX = local_80.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (local_58 << 4 != lVar10);
  }
  ppVar8 = local_80.
           super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar13 = local_80.
            super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_80.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_80.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (local_80.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_80.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_80.
                                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_80.
                                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              ();
    ppVar13 = local_80.
              super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppVar8 = local_80.
             super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (ppVar9 = local_80.
                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar13; ppVar9 = ppVar9 + 1)
    {
      lVar15 = ppVar9->first;
      local_8c = ppVar8->first;
      in_ST5 = in_ST4;
      if (((lVar15 != local_8c) || (ppVar7 = ppVar8, NAN(lVar15) || NAN(local_8c))) &&
         (in_RCX = (pointer)CONCAT71((int7)((ulong)in_RCX >> 8),ppVar9 == ppVar8), ppVar7 = ppVar9,
         0x20 < (long)ppVar9 - (long)ppVar8)) {
        local_64 = lVar15 - local_8c;
        lVar15 = in_ST0;
        lVar17 = in_ST1;
        lVar16 = in_ST2;
        lVar2 = in_ST3;
        lVar3 = in_ST4;
        do {
          in_ST4 = in_ST5;
          in_ST3 = lVar3;
          in_ST2 = lVar2;
          in_ST1 = lVar16;
          in_ST0 = lVar17;
          in_ST5 = in_ST4;
          std::
          generate_canonical<long_double,64ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    ((longdouble *)rng,
                     (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     ppVar11);
          ppVar8->first = local_8c + local_64 * lVar15;
          ppVar8 = ppVar8 + 1;
          lVar15 = in_ST0;
          lVar17 = in_ST1;
          lVar16 = in_ST2;
          lVar2 = in_ST3;
          lVar3 = in_ST4;
        } while (ppVar8 != ppVar9);
      }
      ppVar8 = ppVar7;
    }
  }
  if (0x20 < (long)ppVar13 - (long)ppVar8) {
    if ((long)ppVar8 -
        (long)local_80.
              super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0) {
      local_8c = ppVar8->first;
      lVar15 = (longdouble)1 + local_8c;
      if ((local_8c == lVar15) && (!NAN(local_8c) && !NAN(lVar15))) goto LAB_001a4b1f;
      if (ppVar8 != ppVar13) {
        local_64 = lVar15 - local_8c;
        __urng = (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x0;
        lVar15 = in_ST4;
        do {
          lVar17 = lVar15;
          std::
          generate_canonical<long_double,64ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    ((longdouble *)rng,__urng);
          ppVar8->first = local_8c + local_64 * in_ST0;
          ppVar8 = ppVar8 + 1;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = lVar15;
          lVar15 = lVar17;
        } while (ppVar8 != ppVar13);
      }
    }
    else {
      this_00 = (baryonyx *)
                ((long)ppVar8 -
                 (long)local_80.
                       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      linearize<long,long_double>
                ((longdouble *)0x0,this_00,
                 (long)local_80.
                       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_80.
                       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,
                 (local_80.
                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first,(long)in_RCX,ppVar8->first,in_R8
                );
      local_8c = ppVar8->first;
      if ((local_8c == in_ST0) && (!NAN(local_8c) && !NAN(in_ST0))) {
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
LAB_001a4b1f:
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
        if (local_80.
            super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.
                          super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.
                                super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.
                                super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(extraout_RAX);
      }
      if (ppVar8 != ppVar13) {
        local_64 = in_ST0 - local_8c;
        lVar15 = in_ST5;
        do {
          lVar17 = lVar15;
          std::
          generate_canonical<long_double,64ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    ((longdouble *)rng,
                     (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     this_00);
          ppVar8->first = local_8c + local_64 * in_ST1;
          ppVar8 = ppVar8 + 1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = lVar15;
          lVar15 = lVar17;
        } while (ppVar8 != ppVar13);
      }
    }
  }
  ppVar11 = local_80.
            super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_80.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_80.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (local_80.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_80.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_80.
                                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_80.
                                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (ppVar11);
  }
  if (n != 0) {
    lVar10 = 0;
    plVar1 = (local_50->linear_elements)._M_t.
             super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
             super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
             super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
    do {
      *(unkbyte10 *)((long)plVar1 + lVar10) =
           *(unkbyte10 *)
            ((long)&(local_80.
                     super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first + lVar10 * 2);
      lVar10 = lVar10 + 0x10;
    } while (local_58 << 4 != lVar10);
    plVar5 = plVar1;
    if (n != 1) {
      lVar10 = (long)n * 0x10 + -0x10;
      lVar15 = *plVar1;
      plVar6 = plVar1;
      do {
        plVar6 = plVar6 + 1;
        lVar17 = *plVar6;
        lVar16 = lVar15;
        if (lVar15 <= lVar17 || lVar17 != lVar15) {
          lVar16 = lVar17;
        }
        if (lVar15 < lVar17) {
          plVar5 = plVar6;
        }
        lVar10 = lVar10 + -0x10;
        lVar15 = lVar16;
      } while (lVar10 != 0);
    }
    lVar15 = *plVar5;
    local_48._8_2_ = (undefined2)((unkuint10)lVar15 >> 0x40);
    local_48._0_8_ = SUB108(lVar15,0);
    bVar14 = (long)local_48._0_8_ < 0;
    uVar4 = local_48._8_2_ & 0x7fff;
    local_48._0_10_ = lVar15;
    if ((ushort)(uVar4 - 1) < 0x7ffe && (bVar14 && n != 0)) {
      lVar10 = 0;
      do {
        *(longdouble *)((long)plVar1 + lVar10) = *(longdouble *)((long)plVar1 + lVar10) / lVar15;
        lVar10 = lVar10 + 0x10;
      } while (local_58 << 4 != lVar10);
    }
  }
  if (local_80.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        auto begin = r.begin();
        auto end = r.end();
        auto next = r.begin()++;
        for (; next != end; ++next) {
            if (next->first != begin->first) {
                if (std::distance(begin, next) > 1)
                    random_epsilon_unique(
                      begin, next, rng, begin->first, next->first);

                begin = next;
            }
        }

        if (std::distance(begin, end) > 1) {
            if (begin == r.begin()) {
                random_epsilon_unique(
                  begin, end, rng, begin->first, begin->first + 1);
            } else {
                auto value = linearize(std::ptrdiff_t(0),
                                       r.front().first,
                                       std::distance(r.begin(), begin),
                                       begin->first,
                                       std::distance(r.begin(), r.end()));

                random_epsilon_unique(begin, end, rng, begin->first, value);
            }
        }

        // Reorder the vector according to the variable index, so, it
        // restores the initial order.

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.second < rhs.second;
        });

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;

        // Finally we compute the l+oo norm.

        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);
        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }